

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAffinity.cxx
# Opt level: O3

set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *
cmAffinity::GetProcessorsAvailable(void)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  int iVar3;
  pthread_t __th;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  *in_RDI;
  size_t __cpu;
  ulong uVar4;
  cm_cpuset_t cpuset;
  ulong local_b0;
  cpu_set_t local_a8;
  
  p_Var1 = &(in_RDI->_M_impl).super__Rb_tree_header;
  (in_RDI->_M_impl).super__Rb_tree_header._M_header._M_color = _S_red;
  (in_RDI->_M_impl).super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (in_RDI->_M_impl).super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (in_RDI->_M_impl).super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (in_RDI->_M_impl).super__Rb_tree_header._M_node_count = 0;
  uVar2 = uv_cpumask_size();
  if (0 < (int)uVar2) {
    local_a8.__bits[0xe] = 0;
    local_a8.__bits[0xf] = 0;
    local_a8.__bits[0xc] = 0;
    local_a8.__bits[0xd] = 0;
    local_a8.__bits[10] = 0;
    local_a8.__bits[0xb] = 0;
    local_a8.__bits[8] = 0;
    local_a8.__bits[9] = 0;
    local_a8.__bits[6] = 0;
    local_a8.__bits[7] = 0;
    local_a8.__bits[4] = 0;
    local_a8.__bits[5] = 0;
    local_a8.__bits[2] = 0;
    local_a8.__bits[3] = 0;
    local_a8.__bits[0] = 0;
    local_a8.__bits[1] = 0;
    __th = pthread_self();
    iVar3 = pthread_getaffinity_np(__th,0x80,&local_a8);
    if (iVar3 == 0) {
      uVar4 = 0;
      do {
        if ((uVar4 < 0x400) && ((local_a8.__bits[uVar4 >> 6] >> (uVar4 & 0x3f) & 1) != 0)) {
          local_b0 = uVar4;
          std::
          _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
          ::_M_insert_unique<unsigned_long>(in_RDI,&local_b0);
        }
        uVar4 = uVar4 + 1;
      } while (uVar2 != uVar4);
    }
  }
  return (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)in_RDI;
}

Assistant:

std::set<size_t> GetProcessorsAvailable()
{
  std::set<size_t> processorsAvailable;
#ifdef CM_HAVE_CPU_AFFINITY
  int cpumask_size = uv_cpumask_size();
  if (cpumask_size > 0) {
#  ifdef _WIN32
    DWORD_PTR procmask;
    DWORD_PTR sysmask;
    if (GetProcessAffinityMask(GetCurrentProcess(), &procmask, &sysmask) !=
        0) {
      for (int i = 0; i < cpumask_size; ++i) {
        if (procmask & (((DWORD_PTR)1) << i)) {
          processorsAvailable.insert(i);
        }
      }
    }
#  else
    cm_cpuset_t cpuset;
    CPU_ZERO(&cpuset); // NOLINT(clang-tidy)
    if (pthread_getaffinity_np(pthread_self(), sizeof(cpuset), &cpuset) == 0) {
      for (int i = 0; i < cpumask_size; ++i) {
        if (CPU_ISSET(i, &cpuset)) {
          processorsAvailable.insert(i);
        }
      }
    }
#  endif
  }
#endif
  return processorsAvailable;
}